

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O3

vector<int,_std::allocator<int>_> * __thiscall
fasttext::FastText::selectEmbeddings
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,FastText *this,int32_t cutoff)

{
  int iVar1;
  int iVar2;
  element_type *peVar3;
  pointer piVar4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  int32_t iVar5;
  DenseMatrix *pDVar6;
  int64_t m;
  size_type __n;
  pointer piVar7;
  ulong uVar8;
  int *piVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  DenseMatrix *pDVar11;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __i;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last_00;
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  string_view w;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_facebookresearch[P]fastText_src_fasttext_cc:313:37)>
  __comp;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_facebookresearch[P]fastText_src_fasttext_cc:313:37)>
  __comp_00;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_facebookresearch[P]fastText_src_fasttext_cc:313:37)>
  __comp_01;
  Vector norms;
  allocator_type local_51;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  Vector local_48;
  value_type_conflict1 local_34;
  
  peVar3 = (this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar3 == (element_type *)0x0) {
    p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pDVar11 = (DenseMatrix *)0x0;
  }
  else {
    p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pDVar6 = (DenseMatrix *)__dynamic_cast(peVar3,&Matrix::typeinfo,&DenseMatrix::typeinfo,0);
    pDVar11 = (DenseMatrix *)0x0;
    if (pDVar6 != (DenseMatrix *)0x0) {
      p_Var10 = (this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      pDVar11 = pDVar6;
      if (p_Var10 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
      }
    }
  }
  local_50 = p_Var10;
  m = Matrix::size(&pDVar11->super_Matrix,0);
  Vector::Vector(&local_48,m);
  DenseMatrix::l2NormRow(pDVar11,&local_48);
  __n = Matrix::size(&pDVar11->super_Matrix,0);
  local_34 = 0;
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,__n,&local_34,&local_51);
  piVar7 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  piVar4 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar7 != piVar4) {
    auVar12 = vpmovsxbd_avx512f(_DAT_00142010);
    auVar13 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar14 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar15 = vpbroadcastd_avx512f(ZEXT416(0x10));
    uVar8 = 0;
    auVar16 = vpbroadcastq_avx512f();
    auVar16 = vpsrlq_avx512f(auVar16,2);
    do {
      auVar17 = vpbroadcastq_avx512f();
      auVar18 = vporq_avx512f(auVar17,auVar13);
      auVar17 = vporq_avx512f(auVar17,auVar14);
      vpcmpuq_avx512f(auVar17,auVar16,2);
      vpcmpuq_avx512f(auVar18,auVar16,2);
      auVar17 = vmovdqu32_avx512f(auVar12);
      *(undefined1 (*) [64])(piVar7 + uVar8) = auVar17;
      uVar8 = uVar8 + 0x10;
      auVar12 = vpaddd_avx512f(auVar12,auVar15);
    } while ((((ulong)((long)piVar4 + (-4 - (long)piVar7)) >> 2) + 0x10 & 0xfffffffffffffff0) !=
             uVar8);
  }
  w._M_str = Dictionary::EOS_abi_cxx11_;
  w._M_len = DAT_001523a0;
  iVar5 = Dictionary::getId((this->dict_).
                            super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr,w);
  __first._M_current =
       (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
       super__Vector_impl_data._M_start;
  __last._M_current =
       (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (__first._M_current != __last._M_current) {
    __comp._M_comp.eosid = iVar5;
    __comp._M_comp.norms = &local_48;
    __comp._M_comp._12_4_ = 0;
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<fasttext::FastText::selectEmbeddings(int)const::__0>>
              (__first,__last,
               (ulong)(uint)((int)LZCOUNT((long)__last._M_current - (long)__first._M_current >> 2) *
                            2) ^ 0x7e,__comp);
    if (0x40 < (long)__last._M_current - (long)__first._M_current) {
      __last_00._M_current = __first._M_current + 0x10;
      __comp_00._M_comp.eosid = iVar5;
      __comp_00._M_comp.norms = &local_48;
      __comp_00._M_comp._12_4_ = 0;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<fasttext::FastText::selectEmbeddings(int)const::__0>>
                (__first,__last_00,__comp_00);
LAB_0012fabc:
      if (__last_00._M_current != __last._M_current) {
        iVar1 = *__last_00._M_current;
        piVar9 = __last_00._M_current;
        do {
          iVar2 = piVar9[-1];
          if (iVar2 == iVar5 || iVar1 == iVar5) {
            if ((iVar1 != iVar5) || (iVar2 == iVar5)) goto LAB_0012fb0a;
          }
          else if (local_48.data_.mem_[iVar1] <= local_48.data_.mem_[iVar2]) goto LAB_0012fb0a;
          *piVar9 = iVar2;
          piVar9 = piVar9 + -1;
        } while( true );
      }
      goto LAB_0012fb25;
    }
    __comp_01._M_comp.eosid = iVar5;
    __comp_01._M_comp.norms = &local_48;
    __comp_01._M_comp._12_4_ = 0;
    std::
    __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<fasttext::FastText::selectEmbeddings(int)const::__0>>
              (__first,__last,__comp_01);
  }
LAB_0012fb25:
  piVar7 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start + cutoff;
  if (piVar7 != (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_finish = piVar7;
  }
  free(local_48.data_.mem_);
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  return __return_storage_ptr__;
LAB_0012fb0a:
  *piVar9 = iVar1;
  __last_00._M_current = __last_00._M_current + 1;
  goto LAB_0012fabc;
}

Assistant:

std::vector<int32_t> FastText::selectEmbeddings(int32_t cutoff) const {
  std::shared_ptr<DenseMatrix> input =
      std::dynamic_pointer_cast<DenseMatrix>(input_);
  Vector norms(input->size(0));
  input->l2NormRow(norms);
  std::vector<int32_t> idx(input->size(0), 0);
  std::iota(idx.begin(), idx.end(), 0);
  auto eosid = dict_->getId(Dictionary::EOS);
  std::sort(idx.begin(), idx.end(), [&norms, eosid](size_t i1, size_t i2) {
    if (i1 == eosid && i2 == eosid) { // satisfy strict weak ordering
      return false;
    }
    return eosid == i1 || (eosid != i2 && norms[i1] > norms[i2]);
  });
  idx.erase(idx.begin() + cutoff, idx.end());
  return idx;
}